

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialAssetId::ConfidentialAssetId
          (ConfidentialAssetId *this,ConfidentialAssetId *object)

{
  ByteData *this_00;
  ConfidentialAssetId *object_local;
  ConfidentialAssetId *this_local;
  
  this->_vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_009ebc78;
  this_00 = &this->data_;
  ByteData::ByteData(this_00);
  ByteData::operator=(this_00,(ByteData *)this);
  this->version_ = object->version_;
  return;
}

Assistant:

ConfidentialAssetId::ConfidentialAssetId(const ConfidentialAssetId &object) {
  data_ = object.data_;
  version_ = object.version_;
}